

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

ImVec2 InputTextCalcTextSizeW
                 (ImWchar *text_begin,ImWchar *text_end,ImWchar **remaining,ImVec2 *out_offset,
                 bool stop_on_new_line)

{
  float fVar1;
  float fVar2;
  ImWchar c;
  ImFont *this;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  ImVec2 IVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  float local_48;
  
  this = GImGui->Font;
  fVar1 = GImGui->FontSize;
  fVar2 = this->FontSize;
  auVar7 = ZEXT816(0) << 0x40;
  do {
    auVar8 = ZEXT1664(auVar7);
    auVar10 = ZEXT1664(ZEXT816(0) << 0x40);
    while( true ) {
      do {
        auVar7 = auVar8._0_16_;
        auVar9 = auVar10._0_16_;
        if (text_end <= text_begin) goto LAB_00166a0c;
        c = *text_begin;
        text_begin = text_begin + 1;
      } while (c == 0xd);
      if (c == 10) break;
      fVar5 = ImFont::GetCharAdvance(this,c);
      local_48 = auVar10._0_4_;
      auVar8 = ZEXT1664(auVar7);
      auVar10 = ZEXT464((uint)(local_48 + (fVar1 / fVar2) * fVar5));
    }
    auVar3 = vcmpss_avx(auVar9,auVar7,2);
    auVar9 = vblendvps_avx(auVar9,auVar7,auVar3);
    auVar7 = vmovshdup_avx(auVar7);
    auVar7 = vinsertps_avx(auVar9,ZEXT416((uint)(fVar1 + auVar7._0_4_)),0x1c);
  } while ((char)out_offset == '\0');
  auVar9 = ZEXT816(0) << 0x40;
LAB_00166a0c:
  if (remaining != (ImWchar **)0x0) {
    *remaining = text_begin;
  }
  if (auVar7._0_4_ < auVar9._0_4_) {
    auVar7._0_4_ = auVar9._0_4_;
  }
  IVar6 = auVar7._0_8_;
  auVar4 = vmovshdup_avx(auVar7);
  auVar3 = vcmpps_avx(auVar4,ZEXT816(0) << 0x40,0);
  auVar9 = vcmpps_avx(ZEXT816(0) << 0x40,auVar9,1);
  auVar9 = vorps_avx(auVar9,auVar3);
  if ((auVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)(fVar1 + auVar4._0_4_)),0x10);
    IVar6 = auVar7._0_8_;
  }
  return IVar6;
}

Assistant:

static ImVec2 InputTextCalcTextSizeW(const ImWchar* text_begin, const ImWchar* text_end, const ImWchar** remaining, ImVec2* out_offset, bool stop_on_new_line)
{
    ImGuiContext& g = *GImGui;
    ImFont* font = g.Font;
    const float line_height = g.FontSize;
    const float scale = line_height / font->FontSize;

    ImVec2 text_size = ImVec2(0, 0);
    float line_width = 0.0f;

    const ImWchar* s = text_begin;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)(*s++);
        if (c == '\n')
        {
            text_size.x = ImMax(text_size.x, line_width);
            text_size.y += line_height;
            line_width = 0.0f;
            if (stop_on_new_line)
                break;
            continue;
        }
        if (c == '\r')
            continue;

        const float char_width = font->GetCharAdvance((ImWchar)c) * scale;
        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (out_offset)
        *out_offset = ImVec2(line_width, text_size.y + line_height);  // offset allow for the possibility of sitting after a trailing \n

    if (line_width > 0 || text_size.y == 0.0f)                        // whereas size.y will ignore the trailing \n
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}